

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O0

void __thiscall Command_NoCalls_Test::TestBody(Command_NoCalls_Test *this)

{
  mock_cp *pmVar1;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pMVar2;
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pTVar3;
  WithoutMatchers local_2b1;
  Matcher<const_pstore::broker::broker_command_&> local_2b0;
  Matcher<const_pstore::brokerface::fifo_path_&> local_298;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_280;
  WithoutMatchers local_241;
  Matcher<const_pstore::broker::broker_command_&> local_240;
  Matcher<const_pstore::brokerface::fifo_path_&> local_228;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_210;
  WithoutMatchers local_1d1;
  Matcher<const_pstore::broker::broker_command_&> local_1d0;
  Matcher<const_pstore::brokerface::fifo_path_&> local_1b8;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_1a0;
  WithoutMatchers local_161;
  Matcher<const_pstore::broker::broker_command_&> local_160;
  Matcher<const_pstore::brokerface::fifo_path_&> local_148;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_130;
  WithoutMatchers local_f1;
  Matcher<const_pstore::broker::broker_command_&> local_f0;
  Matcher<const_pstore::brokerface::fifo_path_&> local_d8;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_c0;
  WithoutMatchers local_85 [13];
  Matcher<const_pstore::broker::broker_command_&> local_78;
  Matcher<const_pstore::brokerface::fifo_path_&> local_60;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_48;
  Command_NoCalls_Test *local_10;
  Command_NoCalls_Test *this_local;
  
  local_10 = this;
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  testing::Matcher<pstore::brokerface::fifo_path_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::brokerface::fifo_path_const&> *)&local_60,
             (AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::broker::broker_command_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::broker::broker_command_const&> *)&local_78,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_suicide(&local_48,pmVar1,&local_60,&local_78);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::operator()(&local_48,local_85,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x59,"cp ()","suicide (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar3,0);
  testing::internal::
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  ~MockSpec(&local_48);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_78);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::~Matcher(&local_60);
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  testing::Matcher<pstore::brokerface::fifo_path_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::brokerface::fifo_path_const&> *)&local_d8,
             (AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::broker::broker_command_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::broker::broker_command_const&> *)&local_f0,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_quit(&local_c0,pmVar1,&local_d8,&local_f0);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::operator()(&local_c0,&local_f1,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5a,"cp ()","quit (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar3,0);
  testing::internal::
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  ~MockSpec(&local_c0);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_f0);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::~Matcher(&local_d8);
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  testing::Matcher<pstore::brokerface::fifo_path_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::brokerface::fifo_path_const&> *)&local_148,
             (AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::broker::broker_command_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::broker::broker_command_const&> *)&local_160,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_cquit(&local_130,pmVar1,&local_148,&local_160);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::operator()(&local_130,&local_161,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5b,"cp ()","cquit (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar3,0);
  testing::internal::
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  ~MockSpec(&local_130);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_160);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::~Matcher(&local_148);
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  testing::Matcher<pstore::brokerface::fifo_path_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::brokerface::fifo_path_const&> *)&local_1b8,
             (AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::broker::broker_command_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::broker::broker_command_const&> *)&local_1d0,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_gc(&local_1a0,pmVar1,&local_1b8,&local_1d0);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::operator()(&local_1a0,&local_1d1,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5c,"cp ()","gc (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar3,0);
  testing::internal::
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  ~MockSpec(&local_1a0);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_1d0);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::~Matcher(&local_1b8);
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  testing::Matcher<pstore::brokerface::fifo_path_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::brokerface::fifo_path_const&> *)&local_228,
             (AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::broker::broker_command_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::broker::broker_command_const&> *)&local_240,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_echo(&local_210,pmVar1,&local_228,&local_240);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::operator()(&local_210,&local_241,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5d,"cp ()","echo (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar3,0);
  testing::internal::
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  ~MockSpec(&local_210);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_240);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::~Matcher(&local_228);
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  testing::Matcher<pstore::brokerface::fifo_path_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::brokerface::fifo_path_const&> *)&local_298,
             (AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::broker::broker_command_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::broker::broker_command_const&> *)&local_2b0,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_nop(&local_280,pmVar1,&local_298,&local_2b0);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::operator()(&local_280,&local_2b1,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5e,"cp ()","nop (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar3,0);
  testing::internal::
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>::
  ~MockSpec(&local_280);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_2b0);
  testing::Matcher<const_pstore::brokerface::fifo_path_&>::~Matcher(&local_298);
  return;
}

Assistant:

TEST_F (Command, NoCalls) {
    using ::testing::_;
    EXPECT_CALL (cp (), suicide (_, _)).Times (0);
    EXPECT_CALL (cp (), quit (_, _)).Times (0);
    EXPECT_CALL (cp (), cquit (_, _)).Times (0);
    EXPECT_CALL (cp (), gc (_, _)).Times (0);
    EXPECT_CALL (cp (), echo (_, _)).Times (0);
    EXPECT_CALL (cp (), nop (_, _)).Times (0);
}